

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall EventLoop::removeChannel(EventLoop *this,ChannelPtr *channel)

{
  element_type *this_00;
  EventLoop *pEVar1;
  element_type *this_01;
  shared_ptr<Channel> local_28;
  ChannelPtr *local_18;
  ChannelPtr *channel_local;
  EventLoop *this_local;
  
  local_18 = channel;
  channel_local = (ChannelPtr *)this;
  this_00 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       channel);
  pEVar1 = Channel::ownerLoop(this_00);
  if (pEVar1 == this) {
    assertInLoopThread(this);
    this_01 = std::__shared_ptr_access<EPoller,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<EPoller,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         &this->poller_);
    std::shared_ptr<Channel>::shared_ptr(&local_28,channel);
    EPoller::removeChannel(this_01,&local_28);
    std::shared_ptr<Channel>::~shared_ptr(&local_28);
    return;
  }
  __assert_fail("channel->ownerLoop() == this",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EventLoop.cpp"
                ,0x53,"void EventLoop::removeChannel(ChannelPtr)");
}

Assistant:

void EventLoop::removeChannel(ChannelPtr channel) {
    assert(channel->ownerLoop() == this);
    assertInLoopThread();
    poller_->removeChannel(std::move(channel));
}